

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,Type expected)

{
  Type TVar1;
  bool bVar2;
  Result RVar3;
  Result RVar4;
  Result RVar5;
  Type TVar6;
  bool bVar7;
  Type type2;
  Type type1;
  undefined8 local_38;
  
  local_38 = 0;
  RVar3 = PeekAndCheckType(this,0,(Type)0xffffffff);
  RVar4 = PeekType(this,1,(Type *)((long)&local_38 + 4));
  RVar5 = PeekType(this,2,(Type *)&local_38);
  bVar7 = RVar5.enum_ == Error || (RVar4.enum_ == Error || RVar3.enum_ == Error);
  TVar1.enum_ = local_38._4_4_;
  if (expected.enum_ == Any) {
    bVar2 = true;
    TVar6.enum_ = Any;
    if ((0x1a < (uint)(local_38._4_4_ + ~(Func|I32U))) ||
       ((0x40001c1U >> (local_38._4_4_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
      if ((0x1a < (uint)(local_38._0_4_ + ~(Func|I32U))) ||
         ((0x40001c1U >> (local_38._0_4_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
        RVar3 = CheckType(local_38._4_4_,local_38._0_4_);
        bVar2 = bVar7 || RVar3.enum_ == Error;
        TVar6.enum_ = TVar1.enum_;
      }
    }
  }
  else {
    RVar3 = CheckType(local_38._4_4_,expected);
    RVar4 = CheckType(local_38._0_4_,expected);
    bVar2 = RVar4.enum_ == Error || (bVar7 || RVar3.enum_ == Error);
    TVar6.enum_ = Any;
  }
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar2;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>(this,RVar3,"select",TVar6,TVar6,I32);
  RVar3 = DropTypes(this,3);
  PushType(this,TVar6);
  return (Result)(uint)(byte)(bVar2 | RVar3.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect(Type expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected == Type::Any) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    result |= CheckType(type1, expected);
    result |= CheckType(type2, expected);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}